

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
::reject(AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
         *this,Exception *exception)

{
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> local_200;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_200.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         (exception->ownFile).content.ptr;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         (exception->ownFile).content.size_;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.file = exception->file;
    local_200.super_ExceptionOrValue.exception.ptr.field_1._32_4_ = exception->line;
    local_200.super_ExceptionOrValue.exception.ptr.field_1._36_4_ = exception->type;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         (exception->context).ptr.disposer;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (exception->remoteTrace).content.ptr;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         (exception->remoteTrace).content.size_;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    memcpy((void *)((long)&local_200.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           exception->trace,0x105);
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         (exception->details).builder.ptr;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (exception->details).builder.pos;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (exception->details).builder.endPtr;
    local_200.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_200.value.ptr.isSet = false;
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::operator=(&this->result,&local_200);
    if (local_200.value.ptr.isSet == true) {
      HttpClient::ConnectRequest::Status::~Status(&local_200.value.ptr.field_1.value);
    }
    if (local_200.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_200.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }